

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void AddFilesFromDirectoryToTpaList(char *directory,string *tpaList)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  dirent *pdVar5;
  char *__file;
  _Self local_1b0;
  _Self local_1a8;
  undefined1 local_1a0 [8];
  string filenameWithoutExt;
  int extPos;
  string filename;
  undefined1 local_150 [8];
  stat sb;
  string fullFilename;
  dirent *entry;
  int extLength;
  char *ext;
  undefined1 local_70 [4];
  int extIndex;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedAssemblies;
  DIR *dir;
  char *tpaExtensions [4];
  string *tpaList_local;
  char *directory_local;
  
  tpaExtensions[0] = ".dll";
  tpaExtensions[1] = ".ni.exe";
  tpaExtensions[2] = ".exe";
  tpaExtensions[3] = (char *)tpaList;
  addedAssemblies._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)opendir(directory);
  if ((DIR *)addedAssemblies._M_t._M_impl.super__Rb_tree_header._M_node_count != (DIR *)0x0) {
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_70);
    for (ext._4_4_ = 0; ext._4_4_ < 4; ext._4_4_ = ext._4_4_ + 1) {
      sVar4 = strlen(tpaExtensions[(long)(int)ext._4_4_ + -1]);
LAB_001055cf:
      pdVar5 = readdir((DIR *)addedAssemblies._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (pdVar5 != (dirent *)0x0) {
        uVar1 = pdVar5->d_type;
        if (uVar1 == '\0') goto LAB_00105649;
        if (uVar1 != '\b') goto LAB_0010561d;
        goto LAB_00105737;
      }
      rewinddir((DIR *)addedAssemblies._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    closedir((DIR *)addedAssemblies._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70);
  }
  return;
LAB_0010561d:
  if (uVar1 == '\n') {
LAB_00105649:
    std::__cxx11::string::string((string *)(sb.__glibc_reserved + 2));
    std::__cxx11::string::append((char *)(sb.__glibc_reserved + 2));
    std::__cxx11::string::append((char *)(sb.__glibc_reserved + 2));
    std::__cxx11::string::append((char *)(sb.__glibc_reserved + 2));
    __file = (char *)std::__cxx11::string::c_str();
    iVar3 = stat(__file,(stat *)local_150);
    if (iVar3 == -1) {
      filename.field_2._12_4_ = 5;
    }
    else if (((uint)sb.st_nlink & 0xf000) == 0x8000) {
      filename.field_2._12_4_ = 0;
    }
    else {
      filename.field_2._12_4_ = 5;
    }
    std::__cxx11::string::~string((string *)(sb.__glibc_reserved + 2));
    if (filename.field_2._12_4_ == 0) {
LAB_00105737:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&extPos,pdVar5->d_name,
                 (allocator<char> *)(filenameWithoutExt.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(filenameWithoutExt.field_2._M_local_buf + 0xf));
      iVar3 = std::__cxx11::string::length();
      filenameWithoutExt.field_2._8_4_ = iVar3 - (int)sVar4;
      if (((int)filenameWithoutExt.field_2._8_4_ < 1) ||
         (iVar3 = std::__cxx11::string::compare
                            ((ulong)&extPos,(long)(int)filenameWithoutExt.field_2._8_4_,
                             (char *)(long)(int)sVar4), iVar3 != 0)) {
        filename.field_2._12_4_ = 5;
      }
      else {
        std::__cxx11::string::substr((ulong)local_1a0,(ulong)&extPos);
        local_1a8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_70,(key_type *)local_1a0);
        local_1b0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70);
        bVar2 = std::operator==(&local_1a8,&local_1b0);
        if (bVar2) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70,(value_type *)local_1a0);
          std::__cxx11::string::append(tpaExtensions[3]);
          std::__cxx11::string::append(tpaExtensions[3]);
          std::__cxx11::string::append((string *)tpaExtensions[3]);
          std::__cxx11::string::append(tpaExtensions[3]);
        }
        std::__cxx11::string::~string((string *)local_1a0);
        filename.field_2._12_4_ = 0;
      }
      std::__cxx11::string::~string((string *)&extPos);
    }
  }
  goto LAB_001055cf;
}

Assistant:

void AddFilesFromDirectoryToTpaList(const char *directory,
                                    std::string &tpaList) {
  const char *const tpaExtensions[] = {
      ".ni.dll", // Probe for .ni.dll first so that it's preferred if ni and il
                 // coexist in the same dir
      ".dll",
      ".ni.exe",
      ".exe",
  };

  DIR *dir = opendir(directory);
  if (dir == nullptr) {
    return;
  }

  std::set<std::string> addedAssemblies;

  // Walk the directory for each extension separately so that we first get files
  // with .ni.dll extension, then files with .dll extension, etc.
  for (int extIndex = 0;
       extIndex < sizeof(tpaExtensions) / sizeof(tpaExtensions[0]);
       extIndex++) {
    const char *ext = tpaExtensions[extIndex];
    int extLength = strlen(ext);

    struct dirent *entry;

    // For all entries in the directory
    while ((entry = readdir(dir)) != nullptr) {
      // We are interested in files only
      switch (entry->d_type) {
      case DT_REG:
        break;

      // Handle symlinks and file systems that do not support d_type
      case DT_LNK:
      case DT_UNKNOWN: {
        std::string fullFilename;

        fullFilename.append(directory);
        fullFilename.append("/");
        fullFilename.append(entry->d_name);

        struct stat sb;
        if (stat(fullFilename.c_str(), &sb) == -1) {
          continue;
        }

        if (!S_ISREG(sb.st_mode)) {
          continue;
        }
      } break;

      default:
        continue;
      }

      std::string filename(entry->d_name);

      // Check if the extension matches the one we are looking for
      int extPos = filename.length() - extLength;
      if ((extPos <= 0) || (filename.compare(extPos, extLength, ext) != 0)) {
        continue;
      }

      std::string filenameWithoutExt(filename.substr(0, extPos));

      // Make sure if we have an assembly with multiple extensions present,
      // we insert only one version of it.
      if (addedAssemblies.find(filenameWithoutExt) == addedAssemblies.end()) {
        addedAssemblies.insert(filenameWithoutExt);

        tpaList.append(directory);
        tpaList.append("/");
        tpaList.append(filename);
        tpaList.append(":");
      }
    }

    // Rewind the directory stream to be able to iterate over it for the next
    // extension
    rewinddir(dir);
  }

  closedir(dir);
}